

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O0

void __thiscall ctemplate::TemplateString::AddToGlobalIdToNameMap(TemplateString *this)

{
  bool bVar1;
  value_type *pvVar2;
  unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
  *puVar3;
  UnsafeArena *this_00;
  size_type sVar4;
  pair<std::__detail::_Node_iterator<ctemplate::TemplateString,_true,_true>,_bool> pVar5;
  TemplateString local_98;
  char *local_78;
  char *immutable_copy;
  undefined1 local_68;
  WriterMutexLock local_60;
  WriterMutexLock writer_lock;
  TemplateString *iter;
  ReaderMutexLock reader_lock;
  TemplateString *this_local;
  
  reader_lock.mu_ = (Mutex *)this;
  bVar1 = IsTemplateIdInitialized(this->id_);
  if (bVar1) {
    ReaderMutexLock::ReaderMutexLock((ReaderMutexLock *)&iter,(Mutex *)(anonymous_namespace)::mutex)
    ;
    if (((anonymous_namespace)::template_string_set ==
         (unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
          *)0x0) ||
       (pvVar2 = find_ptr0<std::unordered_set<ctemplate::TemplateString,ctemplate::TemplateStringHasher,std::equal_to<ctemplate::TemplateString>,std::allocator<ctemplate::TemplateString>>,ctemplate::TemplateString>
                           ((anonymous_namespace)::template_string_set,*this),
       pvVar2 == (value_type *)0x0)) {
      writer_lock.mu_._0_4_ = 0;
    }
    else {
      writer_lock.mu_._0_4_ = 1;
    }
    ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&iter);
    if ((int)writer_lock.mu_ == 0) {
      WriterMutexLock::WriterMutexLock(&local_60,(Mutex *)(anonymous_namespace)::mutex);
      if ((anonymous_namespace)::template_string_set ==
          (unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
           *)0x0) {
        puVar3 = (unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
                  *)operator_new(0x40);
        std::
        unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
        ::unordered_set(puVar3);
        (anonymous_namespace)::template_string_set = puVar3;
      }
      if ((anonymous_namespace)::arena == (UnsafeArena *)0x0) {
        this_00 = (UnsafeArena *)operator_new(0x168);
        UnsafeArena::UnsafeArena(this_00,0x400);
        (anonymous_namespace)::arena = this_00;
      }
      sVar4 = std::
              unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
              ::count((anonymous_namespace)::template_string_set,this);
      if (sVar4 == 0) {
        bVar1 = is_immutable(this);
        if (bVar1) {
          pVar5 = std::
                  unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
                  ::insert((anonymous_namespace)::template_string_set,this);
          immutable_copy =
               (char *)pVar5.first.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur
          ;
          local_68 = pVar5.second;
        }
        else {
          local_78 = UnsafeArena::Memdup((anonymous_namespace)::arena,this->ptr_,this->length_);
          puVar3 = (anonymous_namespace)::template_string_set;
          TemplateString(&local_98,local_78,this->length_,true,this->id_);
          std::
          unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
          ::insert(puVar3,&local_98);
        }
        writer_lock.mu_._0_4_ = 0;
      }
      else {
        writer_lock.mu_._0_4_ = 1;
      }
      WriterMutexLock::~WriterMutexLock(&local_60);
    }
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","IsTemplateIdInitialized(id_)");
  exit(1);
}

Assistant:

LOCKS_EXCLUDED(mutex) {
  // shouldn't be calling this if we don't have an id.
  CHECK(IsTemplateIdInitialized(id_));
  {
    // Check to see if it's already here.
    ReaderMutexLock reader_lock(&mutex);
    if (template_string_set) {
      const TemplateString* iter =
          find_ptr0(*template_string_set, *this);
      if (iter) {
        DCHECK_EQ(TemplateString(ptr_, length_),
                  TemplateString(iter->ptr_, iter->length_))
            << "TemplateId collision!";
        return;
      }
    }
  }
  WriterMutexLock writer_lock(&mutex);
  // First initialize our data structures if we need to.
  if (!template_string_set) {
    template_string_set = new TemplateStringSet;
  }

  if (!arena) {
    arena = new UnsafeArena(1024);  // 1024 was picked out of a hat.
  }

  if (template_string_set->count(*this)) {
    return;
  }
  // If we are immutable, we can store ourselves directly in the map.
  // Otherwise, we need to make an immutable copy.
  if (is_immutable()) {
    template_string_set->insert(*this);
  } else {
    const char* immutable_copy = arena->Memdup(ptr_, length_);
    template_string_set->insert(
        TemplateString(immutable_copy, length_, true, id_));
  }
}